

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.h
# Opt level: O3

cmListFileContext *
cmListFileContext::FromListFilePath(cmListFileContext *__return_storage_ptr__,string *filePath)

{
  (__return_storage_ptr__->Name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->Name).field_2
  ;
  (__return_storage_ptr__->Name)._M_string_length = 0;
  (__return_storage_ptr__->Name).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->FilePath)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->FilePath).field_2;
  (__return_storage_ptr__->FilePath)._M_string_length = 0;
  (__return_storage_ptr__->FilePath).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->Line = 0;
  (__return_storage_ptr__->DeferId).
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->FilePath);
  return __return_storage_ptr__;
}

Assistant:

static cmListFileContext FromListFilePath(std::string const& filePath)
  {
    // We are entering a file-level scope but have not yet reached
    // any specific line or command invocation within it.  This context
    // is useful to print when it is at the top but otherwise can be
    // skipped during call stack printing.
    cmListFileContext lfc;
    lfc.FilePath = filePath;
    return lfc;
  }